

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

bool __thiscall cmCPackGenerator::WantsComponentInstallation(cmCPackGenerator *this)

{
  bool bVar1;
  int iVar2;
  char *val;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CPACK_MONOLITHIC_INSTALL","")
  ;
  val = GetOption(this,&local_40);
  bVar1 = cmSystemTools::IsOn(val);
  if (!bVar1) {
    iVar2 = (*(this->super_cmObject)._vptr_cmObject[0x17])(this);
    if ((char)iVar2 != '\0') {
      bVar1 = true;
      if ((this->ComponentGroups)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        bVar1 = (this->Components)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0;
      }
      goto LAB_00244757;
    }
  }
  bVar1 = false;
LAB_00244757:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool cmCPackGenerator::WantsComponentInstallation() const
{
  return (!IsOn("CPACK_MONOLITHIC_INSTALL")
        && SupportsComponentInstallation()
        // check that we have at least one group or component
        && (!this->ComponentGroups.empty() || !this->Components.empty()));
}